

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

void __thiscall ODDLParser::Value::setRef(Value *this,Reference *ref)

{
  size_t sVar1;
  Reference *this_00;
  size_t sizeInBytes;
  Reference *ref_local;
  Value *this_local;
  
  if (this->m_type != ddl_ref) {
    __assert_fail("ddl_ref == m_type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/openddlparser/code/Value.cpp"
                  ,0x115,"void ODDLParser::Value::setRef(Reference *)");
  }
  if ((ref != (Reference *)0x0) && (sVar1 = Reference::sizeInBytes(ref), sVar1 != 0)) {
    if ((this->m_data != (uchar *)0x0) && (this->m_data != (uchar *)0x0)) {
      operator_delete__(this->m_data);
    }
    this_00 = (Reference *)operator_new(0x10);
    Reference::Reference(this_00,ref);
    this->m_data = (uchar *)this_00;
  }
  return;
}

Assistant:

void Value::setRef( Reference *ref ) {
    assert( ddl_ref == m_type );

    if ( ddl_nullptr != ref ) {
        const size_t sizeInBytes( ref->sizeInBytes() );
        if ( sizeInBytes > 0 ) {
            if ( ddl_nullptr != m_data ) {
                delete [] m_data;
            }

            m_data = (unsigned char*) new Reference(*ref);
        }
    }
}